

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

Character * __thiscall World::GetCharacter(World *this,string *name)

{
  pointer ppCVar1;
  Character *pCVar2;
  _Alloc_hider _Var3;
  int iVar4;
  pointer ppCVar5;
  bool bVar6;
  string local_50;
  
  util::lowercase(&local_50,name);
  std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppCVar5 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppCVar5 == ppCVar1) {
      return (Character *)0x0;
    }
    pCVar2 = *ppCVar5;
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_50,pCVar2);
    _Var3._M_p = local_50._M_dataplus._M_p;
    if (local_50._M_string_length == name->_M_string_length) {
      if (local_50._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar4 = bcmp(local_50._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_50._M_string_length);
        bVar6 = iVar4 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_50.field_2) {
      operator_delete(_Var3._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) break;
    ppCVar5 = ppCVar5 + 1;
  }
  return pCVar2;
}

Assistant:

Character *World::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName() == name)
		{
			return character;
		}
	}

	return 0;
}